

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2dff67::WriterThread::run(WriterThread *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  while( true ) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    iVar2 = (anonymous_namespace)::remainingScanlines;
    if (iVar3 != 0) {
      uVar1 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
      _Unwind_Resume(uVar1);
    }
    if ((anonymous_namespace)::remainingScanlines == 0) break;
    dVar4 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
    Imf_3_2::RgbaOutputFile::writePixels((int)this->_outfile);
    (anonymous_namespace)::remainingScanlines =
         (anonymous_namespace)::remainingScanlines -
         (int)((double)iVar2 * dVar4 + (1.0 - dVar4) * 0.0 + 0.5);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    if (iVar2 == 0) {
LAB_001a2a87:
      IlmThread_3_2::Semaphore::post();
      return;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  goto LAB_001a2a87;
}

Assistant:

void
WriterThread::run ()
{

    while (true)
    {
        std::lock_guard<std::mutex> lock (scanlineMutex);

        if (remainingScanlines)
        {
            int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
            _outfile->writePixels (n);
            remainingScanlines -= n;
        }
        else
        {
            break;
        }
    }

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}